

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_optional.hpp
# Opt level: O0

void __thiscall
ak_toolbox::compact_optional_ns::detail_::buffer_storage<evp_minutes>::operator=
          (buffer_storage<evp_minutes> *this,buffer_storage<evp_minutes> *rhs)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  buffer_storage<evp_minutes> *rhs_local;
  buffer_storage<evp_minutes> *this_local;
  
  bVar1 = has_value(this);
  if ((bVar1) && (bVar1 = has_value(rhs), bVar1)) {
    pvVar3 = as_value_type(rhs);
    pvVar2 = as_value_type(this);
    pvVar2->minutes_ = pvVar3->minutes_;
  }
  else {
    bVar1 = has_value(this);
    if ((!bVar1) || (bVar1 = has_value(rhs), bVar1)) {
      bVar1 = has_value(this);
      if ((!bVar1) && (bVar1 = has_value(rhs), bVar1)) {
        pvVar3 = as_value_type(rhs);
        construct(this,pvVar3);
      }
    }
    else {
      destroy(this);
    }
  }
  return;
}

Assistant:

void operator=(const buffer_storage& rhs)
    {
      if (has_value() && rhs.has_value())
      {
        as_value_type() = rhs.as_value_type();
      }
      else if (has_value() && !rhs.has_value())
      {
        destroy();
      }
      else if (!has_value() && rhs.has_value())
      {
        construct(rhs.as_value_type());
      }
    }